

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cc
# Opt level: O3

void __thiscall tt::net::EventLoopThread::threadFunc(EventLoopThread *this)

{
  undefined1 local_a0 [8];
  EventLoop loop;
  
  EventLoop::EventLoop((EventLoop *)local_a0);
  pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  this->m_loop = (EventLoop *)local_a0;
  pthread_cond_signal((pthread_cond_t *)&(this->m_cond).m_cond);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  EventLoop::loop((EventLoop *)local_a0);
  this->m_loop = (EventLoop *)0x0;
  EventLoop::~EventLoop((EventLoop *)local_a0);
  return;
}

Assistant:

void EventLoopThread::threadFunc(){

	EventLoop loop;

	{
		MutexLockGuard lock(m_mutex);
		m_loop = &loop;
		m_cond.notify();
	}

	loop.loop();
	m_loop = NULL;
}